

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_file_v4_binary.cc
# Opt level: O3

void __thiscall
lf::io::(anonymous_namespace)::
MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::ErrorHandler::
operator()(ErrorHandler *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          first,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                last,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          param_3,info *what)

{
  ostream *poVar1;
  string input;
  simple_printer<std::basic_ostream<char,_std::char_traits<char>_>_> pr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  simple_printer<std::basic_ostream<char,_std::char_traits<char>_>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_info_walker<boost::spirit::simple_printer<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  local_30;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_78,this,first._M_current);
  if (0x28 < local_78._M_string_length) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_50,&local_78,0,0x28);
    operator()();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Error in MshFileV4! Expecting ",0x1e);
  local_30.callback = &local_58;
  local_58.out = (basic_ostream<char,_std::char_traits<char>_> *)&std::cout;
  local_30.depth = 0;
  local_30.tag = (utf8_string *)last._M_current;
  boost::
  variant<boost::spirit::info::nil_,std::__cxx11::string,boost::recursive_wrapper<boost::spirit::info>,boost::recursive_wrapper<std::pair<boost::spirit::info,boost::spirit::info>>,boost::recursive_wrapper<std::__cxx11::list<boost::spirit::info,std::allocator<boost::spirit::info>>>>
  ::apply_visitor<boost::spirit::basic_info_walker<boost::spirit::simple_printer<std::ostream>>>
            ((variant<boost::spirit::info::nil_,std::__cxx11::string,boost::recursive_wrapper<boost::spirit::info>,boost::recursive_wrapper<std::pair<boost::spirit::info,boost::spirit::info>>,boost::recursive_wrapper<std::__cxx11::list<boost::spirit::info,std::allocator<boost::spirit::info>>>>
              *)(last._M_current + 0x20),&local_30);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," here: \"",8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_78._M_dataplus._M_p,local_78._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void operator()(FIRST first, LAST last, ERROR_POS /*errorPos*/,
                    WHAT what) const {
      std::string input(first, last);
      if (input.length() > 40) {
        input = input.substr(0, 40);
      }
      std::cout << "Error in MshFileV4! Expecting " << what << " here: \""
                << input << "\"" << std::endl;
    }